

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupWithoutPos(Aig_Man_t *p)

{
  int iVar1;
  Aig_Type_t Type;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_24);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsBuf(pAVar4);
      if (iVar1 != 0) {
        __assert_fail("!Aig_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                      ,0x354,"Aig_Man_t *Aig_ManDupWithoutPos(Aig_Man_t *)");
      }
      iVar1 = Aig_ObjIsNode(pAVar4);
      if (iVar1 != 0) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        Type = Aig_ObjType(pAVar4);
        pAVar5 = Aig_Oper(p_00,pAVar5,p1,Type);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
  }
  iVar1 = Aig_ManBufNum(p);
  if (iVar1 == 0) {
    iVar1 = Aig_ManNodeNum(p);
    iVar2 = Aig_ManNodeNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                    ,0x358,"Aig_Man_t *Aig_ManDupWithoutPos(Aig_Man_t *)");
    }
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupWithoutPos( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        assert( !Aig_ObjIsBuf(pObj) );
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    return pNew;
}